

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O0

upb_Arena * upb_Arena_Init(void *mem,size_t n,upb_alloc *alloc)

{
  ulong uVar1;
  uintptr_t uVar2;
  upb_alloc *local_48;
  size_t delta;
  void *aligned;
  upb_ArenaState *a;
  upb_alloc *alloc_local;
  size_t n_local;
  void *mem_local;
  
  alloc_local = (upb_alloc *)n;
  n_local = (size_t)mem;
  if (n != 0) {
    n_local = (long)mem + 7U & 0xfffffffffffffff8;
    if (n < n_local - (long)mem) {
      local_48 = (upb_alloc *)0x0;
    }
    else {
      local_48 = (upb_alloc *)(n - (n_local - (long)mem));
    }
    alloc_local = local_48;
  }
  uVar1 = (ulong)alloc_local & 0xfffffffffffffff8;
  if (uVar1 < 0x38) {
    mem_local = _upb_Arena_InitSlow(alloc);
  }
  else {
    mem_local = (void *)(n_local + (uVar1 - 0x38));
    uVar2 = _upb_Arena_TaggedFromRefcount(1);
    *(uintptr_t *)((long)mem_local + 0x18) = uVar2;
    *(size_t *)((long)mem_local + 0x20) = 0;
    *(size_t **)((long)mem_local + 0x28) = (size_t *)((long)mem_local + 0x10);
    *(size_t *)((long)mem_local + 0x30) = 0;
    uVar2 = _upb_Arena_MakeBlockAlloc(alloc,true);
    *(uintptr_t *)((long)mem_local + 0x10) = uVar2;
    *(size_t *)mem_local = n_local;
    *(size_t *)((long)mem_local + 8) = n_local + (uVar1 - 0x38);
  }
  return (upb_Arena *)mem_local;
}

Assistant:

upb_Arena* upb_Arena_Init(void* mem, size_t n, upb_alloc* alloc) {
  UPB_ASSERT(sizeof(void*) * UPB_ARENA_SIZE_HACK >= sizeof(upb_ArenaState));
  upb_ArenaState* a;

  if (n) {
    /* Align initial pointer up so that we return properly-aligned pointers. */
    void* aligned = (void*)UPB_ALIGN_UP((uintptr_t)mem, UPB_MALLOC_ALIGN);
    size_t delta = (uintptr_t)aligned - (uintptr_t)mem;
    n = delta <= n ? n - delta : 0;
    mem = aligned;
  }

  /* Round block size down to alignof(*a) since we will allocate the arena
   * itself at the end. */
  n = UPB_ALIGN_DOWN(n, UPB_ALIGN_OF(upb_ArenaState));

  if (UPB_UNLIKELY(n < sizeof(upb_ArenaState))) {
#ifdef UPB_TRACING_ENABLED
    upb_Arena* ret = _upb_Arena_InitSlow(alloc);
    upb_Arena_LogInit(ret, n);
    return ret;
#else
    return _upb_Arena_InitSlow(alloc);
#endif
  }

  a = UPB_PTR_AT(mem, n - sizeof(upb_ArenaState), upb_ArenaState);

  upb_Atomic_Init(&a->body.parent_or_count, _upb_Arena_TaggedFromRefcount(1));
  upb_Atomic_Init(&a->body.next, NULL);
  upb_Atomic_Init(&a->body.tail, &a->body);
  upb_Atomic_Init(&a->body.blocks, NULL);

  a->body.block_alloc = _upb_Arena_MakeBlockAlloc(alloc, 1);
  a->head.UPB_PRIVATE(ptr) = mem;
  a->head.UPB_PRIVATE(end) = UPB_PTR_AT(mem, n - sizeof(upb_ArenaState), char);
#ifdef UPB_TRACING_ENABLED
  upb_Arena_LogInit(&a->head, n);
#endif
  return &a->head;
}